

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__read_next_flac_frame_header
                    (ma_dr_flac_bs *bs,ma_uint8 streaminfoBitsPerSample,
                    ma_dr_flac_frame_header *header)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ma_uint16 *pmVar4;
  ma_uint8 mVar5;
  ma_uint16 mVar6;
  ma_bool32 mVar7;
  ma_result mVar8;
  int iVar9;
  ma_uint32 mVar10;
  uint uVar11;
  ma_dr_flac_frame_header *pmVar12;
  ulong uVar13;
  byte bVar14;
  ushort uVar15;
  uint uVar16;
  undefined7 in_register_00000031;
  ma_dr_flac_cache_t mVar17;
  ma_uint8 hi;
  byte local_72;
  ma_uint8 local_71;
  byte local_70;
  byte local_6f;
  byte local_6e;
  byte local_6d;
  byte local_6c;
  byte local_6b;
  byte local_6a;
  byte local_69;
  ulong local_68;
  ma_dr_flac_frame_header *local_60;
  ma_uint64 local_58;
  uint local_50;
  undefined4 local_4c;
  ma_uint8 *local_48;
  ulong local_40;
  ma_uint16 *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000031,streaminfoBitsPerSample);
  local_70 = 0;
  local_6b = 0;
  local_6c = 0;
  local_6d = 0;
  local_6e = 0;
  local_6f = 0;
  local_60 = header;
  mVar7 = ma_dr_flac__seek_bits(bs,(ulong)(-bs->consumedBits & 7));
  if (mVar7 != 0) {
    local_38 = &local_60->blockSizeInPCMFrames;
    local_48 = &local_60->crc8;
    do {
      while( true ) {
        do {
          bs->crc16 = 0;
          bs->crc16CacheIgnoredBytes = bs->consumedBits >> 3;
          mVar7 = ma_dr_flac__read_uint8(bs,8,(ma_uint8 *)&local_58);
          if (mVar7 == 0) {
            return 0;
          }
        } while ((char)local_58 != -1);
        mVar7 = ma_dr_flac__read_uint8(bs,6,&local_71);
        if (mVar7 == 0) {
          return 0;
        }
        if (local_71 != '>') break;
        mVar7 = ma_dr_flac__read_uint8(bs,1,&local_70);
        if (mVar7 == 0) {
          return 0;
        }
        if (local_70 != 1) {
          bVar14 = ""[~(uint)local_70 & 1];
          mVar7 = ma_dr_flac__read_uint8(bs,1,&local_6b);
          if (mVar7 == 0) {
            return 0;
          }
          local_69 = local_6b;
          bVar14 = (bVar14 ^ 0x9c) * '\x02' ^ ""[(byte)(local_6b & 1 ^ (bVar14 ^ 0x9c) >> 7)];
          mVar7 = ma_dr_flac__read_uint8(bs,4,&local_6c);
          if (mVar7 == 0) {
            return 0;
          }
          if (local_6c != 0) {
            local_50 = (uint)local_6c;
            bVar1 = ""[(byte)(local_6c & 0xf ^ bVar14 >> 4)];
            mVar7 = ma_dr_flac__read_uint8(bs,4,&local_6d);
            if (mVar7 == 0) {
              return 0;
            }
            local_40 = (ulong)local_6d;
            bVar14 = ""[(byte)(local_6d & 0xf ^ (byte)(bVar14 << 4 ^ bVar1) >> 4)];
            mVar7 = ma_dr_flac__read_uint8(bs,4,&local_6e);
            if (mVar7 == 0) {
              return 0;
            }
            local_6a = local_6e;
            if (local_6e < 0xb) {
              bVar14 = bVar14 << 4 ^ ""[(byte)((byte)(bVar1 << 4 ^ bVar14) >> 4 ^ local_6e)];
              mVar7 = ma_dr_flac__read_uint8(bs,3,&local_6f);
              if (mVar7 == 0) {
                return 0;
              }
              if ((local_6f & 0xfb) != 3) {
                bVar14 = bVar14 * '\b' ^ ""[(byte)(local_6f & 7 ^ bVar14 >> 5)];
                local_68 = (ulong)local_6f;
                mVar7 = ma_dr_flac__read_uint8(bs,1,&local_70);
                if (mVar7 == 0) {
                  return 0;
                }
                if (local_70 != 1) {
                  local_72 = bVar14 * '\x02' ^ ""[(byte)(local_70 & 1 ^ bVar14 >> 7)];
                  if (local_69 == 1) {
                    mVar8 = ma_dr_flac__read_utf8_coded_number(bs,&local_58,&local_72);
                    if (mVar8 != MA_SUCCESS) {
LAB_00186190:
                      if (mVar8 == MA_AT_END) {
                        return 0;
                      }
                      goto LAB_001862ec;
                    }
                    local_60->flacFrameNumber = 0;
                    local_60->pcmFrameNumber = local_58;
                  }
                  else {
                    local_58 = 0;
                    mVar8 = ma_dr_flac__read_utf8_coded_number(bs,&local_58,&local_72);
                    if (mVar8 != MA_SUCCESS) goto LAB_00186190;
                    local_60->flacFrameNumber = (ma_uint32)local_58;
                    local_60->pcmFrameNumber = 0;
                  }
                  pmVar4 = local_38;
                  pmVar12 = local_60;
                  mVar6 = 0xc0;
                  if (local_50 != 1) {
                    if ((byte)local_50 < 6) {
                      iVar9 = 0x90;
                      uVar16 = local_50;
LAB_00186278:
                      mVar6 = (ma_uint16)(iVar9 << ((byte)uVar16 & 0x1f));
                    }
                    else {
                      if (local_50 == 7) {
                        mVar7 = ma_dr_flac__read_uint16(bs,0x10,local_38);
                        if (mVar7 == 0) {
                          return 0;
                        }
                        mVar6 = *pmVar4;
                        local_72 = ""[(byte)((byte)mVar6 ^ ""[(byte)((byte)(mVar6 >> 8) ^ local_72)]
                                            )];
                        if (mVar6 == 0xffff) {
                          return 0;
                        }
                      }
                      else {
                        if (local_50 != 6) {
                          uVar16 = (uint)(byte)((byte)local_50 - 8);
                          iVar9 = 0x100;
                          goto LAB_00186278;
                        }
                        mVar7 = ma_dr_flac__read_uint16(bs,8,local_38);
                        if (mVar7 == 0) {
                          return 0;
                        }
                        mVar6 = (ma_uint16)*(undefined4 *)pmVar4;
                        local_72 = ""[(byte)(local_72 ^ (byte)*(undefined4 *)pmVar4)];
                      }
                      mVar6 = mVar6 + 1;
                    }
                  }
                  *pmVar4 = mVar6;
                  if ((byte)local_40 < 0xc) {
                    mVar10 = *(ma_uint32 *)(&DAT_0019bd20 + local_40 * 4);
LAB_00186296:
                    pmVar12->sampleRate = mVar10;
                  }
                  else {
                    if (local_40 == 0xe) {
                      uVar16 = bs->consumedBits;
                      if (uVar16 == 0x40) {
                        mVar7 = ma_dr_flac__reload_cache(bs);
                        if (mVar7 == 0) {
                          return 0;
                        }
                        uVar16 = bs->consumedBits;
                      }
                      uVar13 = 0x40 - (ulong)uVar16;
                      if (uVar13 < 0x10) {
                        uVar2 = bs->cache;
                        mVar7 = ma_dr_flac__reload_cache(bs);
                        if (mVar7 == 0) {
                          return 0;
                        }
                        uVar11 = 0x10 - (int)uVar13;
                        if (0x40 - (ulong)bs->consumedBits < (ulong)uVar11) {
                          return 0;
                        }
                        bVar14 = (byte)uVar11;
                        uVar3 = bs->cache;
                        uVar16 = (uint)((~(0xffffffffffffffffU >> (bVar14 & 0x3f)) & uVar3) >>
                                       (-bVar14 & 0x3f)) |
                                 (int)((~(0xffffffffffffffffU >> ((byte)uVar13 & 0x3f)) & uVar2) >>
                                      ((byte)uVar16 & 0x3f)) << (bVar14 & 0x1f);
                        local_60->sampleRate = uVar16;
                        bs->consumedBits = bs->consumedBits + uVar11;
                        mVar17 = uVar3 << (bVar14 & 0x3f);
                        pmVar12 = local_60;
                      }
                      else {
                        mVar17 = bs->cache;
                        uVar15 = (ushort)(mVar17 >> 0x30);
                        uVar16 = (uint)uVar15;
                        pmVar12->sampleRate = (uint)uVar15;
                        bs->consumedBits = bs->consumedBits + 0x10;
                        mVar17 = mVar17 << 0x10;
                      }
                      bs->cache = mVar17;
                      local_72 = ""[(byte)(""[(byte)((byte)(uVar16 >> 8) ^ local_72)] ^ (byte)uVar16
                                          )];
                      mVar10 = uVar16 * 10;
                      goto LAB_00186296;
                    }
                    if ((int)local_40 == 0xd) {
                      uVar16 = bs->consumedBits;
                      if (uVar16 == 0x40) {
                        mVar7 = ma_dr_flac__reload_cache(bs);
                        if (mVar7 == 0) {
                          return 0;
                        }
                        uVar16 = bs->consumedBits;
                      }
                      uVar13 = 0x40 - (ulong)uVar16;
                      if (uVar13 < 0x10) {
                        uVar2 = bs->cache;
                        mVar7 = ma_dr_flac__reload_cache(bs);
                        if (mVar7 == 0) {
                          return 0;
                        }
                        uVar11 = 0x10 - (int)uVar13;
                        if (0x40 - (ulong)bs->consumedBits < (ulong)uVar11) {
                          return 0;
                        }
                        bVar14 = (byte)uVar11;
                        uVar3 = bs->cache;
                        uVar16 = (uint)((~(0xffffffffffffffffU >> (bVar14 & 0x3f)) & uVar3) >>
                                       (-bVar14 & 0x3f)) |
                                 (int)((~(0xffffffffffffffffU >> ((byte)uVar13 & 0x3f)) & uVar2) >>
                                      ((byte)uVar16 & 0x3f)) << (bVar14 & 0x1f);
                        uVar15 = (ushort)uVar16;
                        local_60->sampleRate = uVar16;
                        bs->consumedBits = bs->consumedBits + uVar11;
                        mVar17 = uVar3 << (bVar14 & 0x3f);
                      }
                      else {
                        mVar17 = bs->cache;
                        uVar15 = (ushort)(mVar17 >> 0x30);
                        local_60->sampleRate = (uint)uVar15;
                        bs->consumedBits = bs->consumedBits + 0x10;
                        mVar17 = mVar17 << 0x10;
                      }
                      bs->cache = mVar17;
                      local_72 = ""[(byte)((byte)uVar15 ^ ""[(byte)((byte)(uVar15 >> 8) ^ local_72)]
                                          )];
                      pmVar12 = local_60;
                    }
                    else {
                      if ((int)local_40 != 0xc) goto LAB_001862ec;
                      uVar16 = bs->consumedBits;
                      if (uVar16 == 0x40) {
                        mVar7 = ma_dr_flac__reload_cache(bs);
                        if (mVar7 == 0) {
                          return 0;
                        }
                        uVar16 = bs->consumedBits;
                      }
                      uVar13 = 0x40 - (ulong)uVar16;
                      if (uVar13 < 8) {
                        uVar2 = bs->cache;
                        mVar7 = ma_dr_flac__reload_cache(bs);
                        if (mVar7 == 0) {
                          return 0;
                        }
                        uVar11 = 8 - (int)uVar13;
                        if (0x40 - (ulong)bs->consumedBits < (ulong)uVar11) {
                          return 0;
                        }
                        bVar14 = (byte)uVar11;
                        uVar3 = bs->cache;
                        uVar16 = (uint)((~(0xffffffffffffffffU >> (bVar14 & 0x3f)) & uVar3) >>
                                       (-bVar14 & 0x3f)) |
                                 (int)((~(0xffffffffffffffffU >> ((byte)uVar13 & 0x3f)) & uVar2) >>
                                      ((byte)uVar16 & 0x3f)) << (bVar14 & 0x1f);
                        local_60->sampleRate = uVar16;
                        bs->consumedBits = bs->consumedBits + uVar11;
                        mVar17 = uVar3 << (bVar14 & 0x3f);
                      }
                      else {
                        mVar17 = bs->cache;
                        uVar16 = (uint)(byte)(mVar17 >> 0x38);
                        local_60->sampleRate = uVar16;
                        bs->consumedBits = bs->consumedBits + 8;
                        mVar17 = mVar17 << 8;
                      }
                      bs->cache = mVar17;
                      local_72 = ""[(byte)(local_72 ^ (byte)uVar16)];
                      local_60->sampleRate = uVar16 * 1000;
                      pmVar12 = local_60;
                    }
                  }
                  pmVar12->channelAssignment = local_6a;
                  mVar5 = (&DAT_00199a50)[local_68];
                  if (local_68 == 0) {
                    mVar5 = (ma_uint8)local_4c;
                  }
                  pmVar12->bitsPerSample = mVar5;
                  if (mVar5 != (ma_uint8)local_4c) {
                    return 0;
                  }
                  mVar7 = ma_dr_flac__read_uint8(bs,8,local_48);
                  if (mVar7 == 0) {
                    return 0;
                  }
                  if (*local_48 == local_72) {
                    return 1;
                  }
                }
              }
            }
          }
        }
LAB_001862ec:
        local_72 = 0xce;
        local_70 = 0;
        local_6b = 0;
        local_6c = 0;
        local_6d = 0;
        local_6e = 0;
        local_6f = 0;
        mVar7 = ma_dr_flac__seek_bits(bs,(ulong)(-bs->consumedBits & 7));
        if (mVar7 == 0) {
          return 0;
        }
      }
      mVar7 = ma_dr_flac__seek_bits(bs,(ulong)(-bs->consumedBits & 7));
    } while (mVar7 != 0);
  }
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__read_next_flac_frame_header(ma_dr_flac_bs* bs, ma_uint8 streaminfoBitsPerSample, ma_dr_flac_frame_header* header)
{
    const ma_uint32 sampleRateTable[12]  = {0, 88200, 176400, 192000, 8000, 16000, 22050, 24000, 32000, 44100, 48000, 96000};
    const ma_uint8 bitsPerSampleTable[8] = {0, 8, 12, (ma_uint8)-1, 16, 20, 24, (ma_uint8)-1};
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(header != NULL);
    for (;;) {
        ma_uint8 crc8 = 0xCE;
        ma_uint8 reserved = 0;
        ma_uint8 blockingStrategy = 0;
        ma_uint8 blockSize = 0;
        ma_uint8 sampleRate = 0;
        ma_uint8 channelAssignment = 0;
        ma_uint8 bitsPerSample = 0;
        ma_bool32 isVariableBlockSize;
        if (!ma_dr_flac__find_and_seek_to_next_sync_code(bs)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_uint8(bs, 1, &reserved)) {
            return MA_FALSE;
        }
        if (reserved == 1) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, reserved, 1);
        if (!ma_dr_flac__read_uint8(bs, 1, &blockingStrategy)) {
            return MA_FALSE;
        }
        crc8 = ma_dr_flac_crc8(crc8, blockingStrategy, 1);
        if (!ma_dr_flac__read_uint8(bs, 4, &blockSize)) {
            return MA_FALSE;
        }
        if (blockSize == 0) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, blockSize, 4);
        if (!ma_dr_flac__read_uint8(bs, 4, &sampleRate)) {
            return MA_FALSE;
        }
        crc8 = ma_dr_flac_crc8(crc8, sampleRate, 4);
        if (!ma_dr_flac__read_uint8(bs, 4, &channelAssignment)) {
            return MA_FALSE;
        }
        if (channelAssignment > 10) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, channelAssignment, 4);
        if (!ma_dr_flac__read_uint8(bs, 3, &bitsPerSample)) {
            return MA_FALSE;
        }
        if (bitsPerSample == 3 || bitsPerSample == 7) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, bitsPerSample, 3);
        if (!ma_dr_flac__read_uint8(bs, 1, &reserved)) {
            return MA_FALSE;
        }
        if (reserved == 1) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, reserved, 1);
        isVariableBlockSize = blockingStrategy == 1;
        if (isVariableBlockSize) {
            ma_uint64 pcmFrameNumber;
            ma_result result = ma_dr_flac__read_utf8_coded_number(bs, &pcmFrameNumber, &crc8);
            if (result != MA_SUCCESS) {
                if (result == MA_AT_END) {
                    return MA_FALSE;
                } else {
                    continue;
                }
            }
            header->flacFrameNumber  = 0;
            header->pcmFrameNumber = pcmFrameNumber;
        } else {
            ma_uint64 flacFrameNumber = 0;
            ma_result result = ma_dr_flac__read_utf8_coded_number(bs, &flacFrameNumber, &crc8);
            if (result != MA_SUCCESS) {
                if (result == MA_AT_END) {
                    return MA_FALSE;
                } else {
                    continue;
                }
            }
            header->flacFrameNumber  = (ma_uint32)flacFrameNumber;
            header->pcmFrameNumber = 0;
        }
        MA_DR_FLAC_ASSERT(blockSize > 0);
        if (blockSize == 1) {
            header->blockSizeInPCMFrames = 192;
        } else if (blockSize <= 5) {
            MA_DR_FLAC_ASSERT(blockSize >= 2);
            header->blockSizeInPCMFrames = 576 * (1 << (blockSize - 2));
        } else if (blockSize == 6) {
            if (!ma_dr_flac__read_uint16(bs, 8, &header->blockSizeInPCMFrames)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->blockSizeInPCMFrames, 8);
            header->blockSizeInPCMFrames += 1;
        } else if (blockSize == 7) {
            if (!ma_dr_flac__read_uint16(bs, 16, &header->blockSizeInPCMFrames)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->blockSizeInPCMFrames, 16);
            if (header->blockSizeInPCMFrames == 0xFFFF) {
                return MA_FALSE;
            }
            header->blockSizeInPCMFrames += 1;
        } else {
            MA_DR_FLAC_ASSERT(blockSize >= 8);
            header->blockSizeInPCMFrames = 256 * (1 << (blockSize - 8));
        }
        if (sampleRate <= 11) {
            header->sampleRate = sampleRateTable[sampleRate];
        } else if (sampleRate == 12) {
            if (!ma_dr_flac__read_uint32(bs, 8, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 8);
            header->sampleRate *= 1000;
        } else if (sampleRate == 13) {
            if (!ma_dr_flac__read_uint32(bs, 16, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 16);
        } else if (sampleRate == 14) {
            if (!ma_dr_flac__read_uint32(bs, 16, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 16);
            header->sampleRate *= 10;
        } else {
            continue;
        }
        header->channelAssignment = channelAssignment;
        header->bitsPerSample = bitsPerSampleTable[bitsPerSample];
        if (header->bitsPerSample == 0) {
            header->bitsPerSample = streaminfoBitsPerSample;
        }
        if (header->bitsPerSample != streaminfoBitsPerSample) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_uint8(bs, 8, &header->crc8)) {
            return MA_FALSE;
        }
#ifndef MA_DR_FLAC_NO_CRC
        if (header->crc8 != crc8) {
            continue;
        }
#endif
        return MA_TRUE;
    }
}